

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<hgdb::rtl::Serializer,_true,_false>::visit<slang::ast::StringType>
          (ASTVisitor<hgdb::rtl::Serializer,_true,_false> *this,StringType *t)

{
  StringType *t_local;
  ASTVisitor<hgdb::rtl::Serializer,_true,_false> *this_local;
  
  visitDefault<slang::ast::StringType>(this,t);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (is_detected_v<handle_t, TDerived, T>)
            static_cast<TDerived*>(this)->handle(t);
        else if constexpr (is_detected_v<op_t, TDerived, T>)
            (DERIVED)(t);
        else
            visitDefault(t);
    }